

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall
TestCharReaderAllowDropNullTestissue178::runTestCase(TestCharReaderAllowDropNullTestissue178 *this)

{
  undefined8 uVar1;
  ArrayIndex index;
  bool bVar2;
  byte bVar3;
  undefined1 uVar4;
  byte bVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  uint uVar8;
  ValueType expected;
  ArrayIndex AVar9;
  uint uVar10;
  ArrayIndex actual;
  long in_RDI;
  bool ok_14;
  char doc_14 [8];
  bool ok_13;
  char doc_13 [8];
  bool ok_12;
  char doc_12 [8];
  bool ok_11;
  char doc_11 [9];
  bool ok_10;
  char doc_10 [9];
  bool ok_9;
  char doc_9 [9];
  bool ok_8;
  char doc_8 [5];
  bool ok_7;
  char doc_7 [8];
  bool ok_6;
  char doc_6 [8];
  bool ok_5;
  char doc_5 [6];
  bool ok_4;
  char doc_4 [4];
  bool ok_3;
  char doc_3 [7];
  bool ok_2;
  char doc_2 [3];
  bool ok_1;
  char doc_1 [7];
  bool ok;
  char doc [16];
  CharReader *reader;
  string errs;
  Value root;
  CharReaderBuilder b;
  Value *in_stack_fffffffffffff7e8;
  Value *in_stack_fffffffffffff7f0;
  CharReaderBuilder *this_00;
  char *in_stack_fffffffffffff7f8;
  CharReaderBuilder *in_stack_fffffffffffff800;
  uint line;
  char *file;
  uint in_stack_fffffffffffff808;
  undefined2 in_stack_fffffffffffff80c;
  undefined1 in_stack_fffffffffffff80e;
  undefined1 in_stack_fffffffffffff80f;
  TestResult *in_stack_fffffffffffff810;
  TestResult *this_01;
  Value *in_stack_fffffffffffff818;
  CharReaderBuilder *in_stack_fffffffffffff820;
  Value *this_02;
  Value *in_stack_fffffffffffff868;
  Value *other;
  Value *in_stack_fffffffffffff870;
  Value *this_03;
  undefined7 in_stack_fffffffffffff878;
  undefined1 in_stack_fffffffffffff87f;
  undefined8 in_stack_fffffffffffff880;
  undefined4 in_stack_fffffffffffff888;
  undefined2 in_stack_fffffffffffff88c;
  undefined1 in_stack_fffffffffffff88e;
  undefined1 in_stack_fffffffffffff88f;
  Value *in_stack_fffffffffffff890;
  Value *actual_00;
  ValueType in_stack_fffffffffffff89c;
  TestResult *in_stack_fffffffffffff8a0;
  TestResult *result;
  undefined1 local_5a0 [4];
  ArrayIndex index_00;
  Value *in_stack_fffffffffffffa68;
  string local_570 [39];
  allocator local_549;
  string local_548 [39];
  byte local_521;
  undefined8 local_520;
  string local_4f0 [39];
  undefined1 local_4c9 [40];
  byte local_4a1;
  undefined8 local_4a0;
  byte local_491;
  undefined8 local_490;
  undefined1 local_488 [8];
  string local_480 [39];
  allocator local_459;
  string local_458 [39];
  byte local_431;
  undefined8 local_430;
  undefined1 local_428 [8];
  string local_420 [39];
  allocator local_3f9;
  string local_3f8 [39];
  byte local_3d1;
  undefined8 local_3d0;
  undefined1 local_3c8 [8];
  string local_3c0 [39];
  allocator local_399;
  string local_398 [39];
  byte local_371;
  undefined4 local_370;
  undefined1 local_36c [3];
  byte local_369;
  undefined8 local_368;
  string local_360 [39];
  allocator local_339;
  string local_338 [39];
  byte local_311;
  undefined8 local_310;
  string local_308 [39];
  allocator local_2e1;
  string local_2e0 [39];
  byte local_2b9;
  undefined4 local_2b8;
  undefined2 local_2b4;
  string local_2b0 [39];
  allocator local_289;
  string local_288 [39];
  byte local_261;
  undefined4 local_260;
  byte local_259;
  undefined4 local_258;
  undefined1 auStack_254 [47];
  byte local_225;
  undefined2 local_224;
  undefined1 local_222 [82];
  string local_1d0 [39];
  allocator local_1a9;
  string local_1a8 [39];
  byte local_181;
  undefined4 local_180;
  undefined1 auStack_17c [84];
  string local_128 [39];
  allocator local_101;
  string local_100 [39];
  byte local_d9;
  char local_d8 [24];
  CharReader *local_c0;
  string local_b8 [32];
  undefined1 local_98 [152];
  
  index_00 = (ArrayIndex)((ulong)_local_5a0 >> 0x20);
  uVar10 = (uint)((ulong)in_stack_fffffffffffff880 >> 0x20);
  Json::CharReaderBuilder::CharReaderBuilder(in_stack_fffffffffffff800);
  Json::Value::Value(in_stack_fffffffffffff7f0,SUB81((ulong)in_stack_fffffffffffff7e8 >> 0x38,0));
  Json::Value::operator[]((Value *)in_stack_fffffffffffff800,in_stack_fffffffffffff7f8);
  Json::Value::operator=(in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
  Json::Value::~Value((Value *)in_stack_fffffffffffff820);
  Json::Value::Value((Value *)in_stack_fffffffffffff800,
                     (ValueType)((ulong)in_stack_fffffffffffff7f8 >> 0x20));
  std::__cxx11::string::string(local_b8);
  local_c0 = Json::CharReaderBuilder::newCharReader(in_stack_fffffffffffff820);
  builtin_strncpy(local_d8,"{\"a\":,\"b\":true}",0x10);
  uVar8 = (*local_c0->_vptr_CharReader[2])(local_c0,local_d8,local_d8 + 0xf,local_98,local_b8);
  local_d9 = (byte)uVar8 & 1;
  if ((uVar8 & 1) == 0) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffff810,
               (char *)CONCAT17(in_stack_fffffffffffff80f,
                                CONCAT16(in_stack_fffffffffffff80e,
                                         CONCAT24(in_stack_fffffffffffff80c,
                                                  in_stack_fffffffffffff808))),
               (uint)((ulong)in_stack_fffffffffffff800 >> 0x20),in_stack_fffffffffffff7f8);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_100,"",&local_101);
  std::__cxx11::string::string(local_128,local_b8);
  JsonTest::checkStringEqual
            (in_stack_fffffffffffff810,
             (string *)
             CONCAT17(in_stack_fffffffffffff80f,
                      CONCAT16(in_stack_fffffffffffff80e,
                               CONCAT24(in_stack_fffffffffffff80c,in_stack_fffffffffffff808))),
             (string *)in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,
             (uint)((ulong)in_stack_fffffffffffff7f0 >> 0x20),(char *)in_stack_fffffffffffff7e8);
  std::__cxx11::string::~string(local_128);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  Json::Value::size((Value *)CONCAT17(in_stack_fffffffffffff80f,
                                      CONCAT16(in_stack_fffffffffffff80e,
                                               CONCAT24(in_stack_fffffffffffff80c,
                                                        in_stack_fffffffffffff808))));
  JsonTest::checkEqual<unsigned_int,unsigned_int>
            (in_stack_fffffffffffff810,
             CONCAT13(in_stack_fffffffffffff80f,
                      CONCAT12(in_stack_fffffffffffff80e,in_stack_fffffffffffff80c)),
             in_stack_fffffffffffff808,(char *)in_stack_fffffffffffff800,
             (uint)((ulong)in_stack_fffffffffffff7f8 >> 0x20),(char *)in_stack_fffffffffffff7f0);
  Json::Value::Value(in_stack_fffffffffffff7f0,SUB81((ulong)in_stack_fffffffffffff7e8 >> 0x38,0));
  Json::Value::get(in_stack_fffffffffffff818,(char *)in_stack_fffffffffffff810,
                   (Value *)CONCAT17(in_stack_fffffffffffff80f,
                                     CONCAT16(in_stack_fffffffffffff80e,
                                              CONCAT24(in_stack_fffffffffffff80c,
                                                       in_stack_fffffffffffff808))));
  JsonTest::checkEqual<Json::ValueType,Json::Value>
            (in_stack_fffffffffffff8a0,in_stack_fffffffffffff89c,in_stack_fffffffffffff890,
             (char *)CONCAT17(in_stack_fffffffffffff88f,
                              CONCAT16(in_stack_fffffffffffff88e,
                                       CONCAT24(in_stack_fffffffffffff88c,in_stack_fffffffffffff888)
                                      )),uVar10,
             (char *)CONCAT17(in_stack_fffffffffffff87f,in_stack_fffffffffffff878));
  Json::Value::~Value((Value *)in_stack_fffffffffffff820);
  Json::Value::~Value((Value *)in_stack_fffffffffffff820);
  auStack_17c._0_3_ = 0x7d3a;
  local_180 = 0x2261227b;
  uVar8 = (*local_c0->_vptr_CharReader[2])(local_c0,&local_180,auStack_17c + 2,local_98,local_b8);
  local_181 = (byte)uVar8 & 1;
  if ((uVar8 & 1) == 0) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffff810,
               (char *)CONCAT17(in_stack_fffffffffffff80f,
                                CONCAT16(in_stack_fffffffffffff80e,
                                         CONCAT24(in_stack_fffffffffffff80c,
                                                  in_stack_fffffffffffff808))),
               (uint)((ulong)in_stack_fffffffffffff800 >> 0x20),in_stack_fffffffffffff7f8);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a8,"",&local_1a9);
  std::__cxx11::string::string(local_1d0,local_b8);
  JsonTest::checkStringEqual
            (in_stack_fffffffffffff810,
             (string *)
             CONCAT17(in_stack_fffffffffffff80f,
                      CONCAT16(in_stack_fffffffffffff80e,
                               CONCAT24(in_stack_fffffffffffff80c,in_stack_fffffffffffff808))),
             (string *)in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,
             (uint)((ulong)in_stack_fffffffffffff7f0 >> 0x20),(char *)in_stack_fffffffffffff7e8);
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  Json::Value::size((Value *)CONCAT17(in_stack_fffffffffffff80f,
                                      CONCAT16(in_stack_fffffffffffff80e,
                                               CONCAT24(in_stack_fffffffffffff80c,
                                                        in_stack_fffffffffffff808))));
  JsonTest::checkEqual<unsigned_int,unsigned_int>
            (in_stack_fffffffffffff810,
             CONCAT13(in_stack_fffffffffffff80f,
                      CONCAT12(in_stack_fffffffffffff80e,in_stack_fffffffffffff80c)),
             in_stack_fffffffffffff808,(char *)in_stack_fffffffffffff800,
             (uint)((ulong)in_stack_fffffffffffff7f8 >> 0x20),(char *)in_stack_fffffffffffff7f0);
  Json::Value::Value(in_stack_fffffffffffff7f0,SUB81((ulong)in_stack_fffffffffffff7e8 >> 0x38,0));
  Json::Value::get(in_stack_fffffffffffff818,(char *)in_stack_fffffffffffff810,
                   (Value *)CONCAT17(in_stack_fffffffffffff80f,
                                     CONCAT16(in_stack_fffffffffffff80e,
                                              CONCAT24(in_stack_fffffffffffff80c,
                                                       in_stack_fffffffffffff808))));
  JsonTest::checkEqual<Json::ValueType,Json::Value>
            (in_stack_fffffffffffff8a0,in_stack_fffffffffffff89c,in_stack_fffffffffffff890,
             (char *)CONCAT17(in_stack_fffffffffffff88f,
                              CONCAT16(in_stack_fffffffffffff88e,
                                       CONCAT24(in_stack_fffffffffffff88c,in_stack_fffffffffffff888)
                                      )),uVar10,
             (char *)CONCAT17(in_stack_fffffffffffff87f,in_stack_fffffffffffff878));
  Json::Value::~Value((Value *)in_stack_fffffffffffff820);
  Json::Value::~Value((Value *)in_stack_fffffffffffff820);
  local_222[0] = 0;
  local_224 = 0x5d5b;
  uVar8 = (*local_c0->_vptr_CharReader[2])(local_c0,&local_224,local_222,local_98,local_b8);
  local_225 = (byte)uVar8 & 1;
  if ((uVar8 & 1) == 0) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffff810,
               (char *)CONCAT17(in_stack_fffffffffffff80f,
                                CONCAT16(in_stack_fffffffffffff80e,
                                         CONCAT24(in_stack_fffffffffffff80c,
                                                  in_stack_fffffffffffff808))),
               (uint)((ulong)in_stack_fffffffffffff800 >> 0x20),in_stack_fffffffffffff7f8);
  }
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffff7f0,(char *)in_stack_fffffffffffff7e8);
  if (!bVar2) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffff810,
               (char *)CONCAT17(in_stack_fffffffffffff80f,
                                CONCAT16(in_stack_fffffffffffff80e,
                                         CONCAT24(in_stack_fffffffffffff80c,
                                                  in_stack_fffffffffffff808))),
               (uint)((ulong)in_stack_fffffffffffff800 >> 0x20),in_stack_fffffffffffff7f8);
  }
  Json::Value::size((Value *)CONCAT17(in_stack_fffffffffffff80f,
                                      CONCAT16(in_stack_fffffffffffff80e,
                                               CONCAT24(in_stack_fffffffffffff80c,
                                                        in_stack_fffffffffffff808))));
  JsonTest::checkEqual<unsigned_int,unsigned_int>
            (in_stack_fffffffffffff810,
             CONCAT13(in_stack_fffffffffffff80f,
                      CONCAT12(in_stack_fffffffffffff80e,in_stack_fffffffffffff80c)),
             in_stack_fffffffffffff808,(char *)in_stack_fffffffffffff800,
             (uint)((ulong)in_stack_fffffffffffff7f8 >> 0x20),(char *)in_stack_fffffffffffff7f0);
  Json::Value::Value(in_stack_fffffffffffff870,in_stack_fffffffffffff868);
  JsonTest::checkEqual<Json::ValueType,Json::Value>
            (in_stack_fffffffffffff8a0,in_stack_fffffffffffff89c,in_stack_fffffffffffff890,
             (char *)CONCAT17(in_stack_fffffffffffff88f,
                              CONCAT16(in_stack_fffffffffffff88e,
                                       CONCAT24(in_stack_fffffffffffff88c,in_stack_fffffffffffff888)
                                      )),uVar10,
             (char *)CONCAT17(in_stack_fffffffffffff87f,in_stack_fffffffffffff878));
  Json::Value::~Value((Value *)in_stack_fffffffffffff820);
  auStack_254._0_3_ = 0x5d6c;
  local_258 = 0x6c756e5b;
  uVar8 = (*local_c0->_vptr_CharReader[2])(local_c0,&local_258,auStack_254 + 2,local_98,local_b8);
  local_259 = (byte)uVar8 & 1;
  if ((uVar8 & 1) == 0) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffff810,
               (char *)CONCAT17(in_stack_fffffffffffff80f,
                                CONCAT16(in_stack_fffffffffffff80e,
                                         CONCAT24(in_stack_fffffffffffff80c,
                                                  in_stack_fffffffffffff808))),
               (uint)((ulong)in_stack_fffffffffffff800 >> 0x20),in_stack_fffffffffffff7f8);
  }
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffff7f0,(char *)in_stack_fffffffffffff7e8);
  if (!bVar2) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffff810,
               (char *)CONCAT17(in_stack_fffffffffffff80f,
                                CONCAT16(in_stack_fffffffffffff80e,
                                         CONCAT24(in_stack_fffffffffffff80c,
                                                  in_stack_fffffffffffff808))),
               (uint)((ulong)in_stack_fffffffffffff800 >> 0x20),in_stack_fffffffffffff7f8);
  }
  Json::Value::size((Value *)CONCAT17(in_stack_fffffffffffff80f,
                                      CONCAT16(in_stack_fffffffffffff80e,
                                               CONCAT24(in_stack_fffffffffffff80c,
                                                        in_stack_fffffffffffff808))));
  JsonTest::checkEqual<unsigned_int,unsigned_int>
            (in_stack_fffffffffffff810,
             CONCAT13(in_stack_fffffffffffff80f,
                      CONCAT12(in_stack_fffffffffffff80e,in_stack_fffffffffffff80c)),
             in_stack_fffffffffffff808,(char *)in_stack_fffffffffffff800,
             (uint)((ulong)in_stack_fffffffffffff7f8 >> 0x20),(char *)in_stack_fffffffffffff7f0);
  local_260 = 0x5d2c5b;
  uVar8 = (*local_c0->_vptr_CharReader[2])
                    (local_c0,&local_260,(long)&local_260 + 3,local_98,local_b8);
  local_261 = (byte)uVar8 & 1;
  if ((uVar8 & 1) == 0) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffff810,
               (char *)CONCAT17(in_stack_fffffffffffff80f,
                                CONCAT16(in_stack_fffffffffffff80e,
                                         CONCAT24(in_stack_fffffffffffff80c,
                                                  in_stack_fffffffffffff808))),
               (uint)((ulong)in_stack_fffffffffffff800 >> 0x20),in_stack_fffffffffffff7f8);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_288,"",&local_289);
  std::__cxx11::string::string(local_2b0,local_b8);
  JsonTest::checkStringEqual
            (in_stack_fffffffffffff810,
             (string *)
             CONCAT17(in_stack_fffffffffffff80f,
                      CONCAT16(in_stack_fffffffffffff80e,
                               CONCAT24(in_stack_fffffffffffff80c,in_stack_fffffffffffff808))),
             (string *)in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,
             (uint)((ulong)in_stack_fffffffffffff7f0 >> 0x20),(char *)in_stack_fffffffffffff7e8);
  std::__cxx11::string::~string(local_2b0);
  std::__cxx11::string::~string(local_288);
  std::allocator<char>::~allocator((allocator<char> *)&local_289);
  Json::Value::size((Value *)CONCAT17(in_stack_fffffffffffff80f,
                                      CONCAT16(in_stack_fffffffffffff80e,
                                               CONCAT24(in_stack_fffffffffffff80c,
                                                        in_stack_fffffffffffff808))));
  JsonTest::checkEqual<unsigned_int,unsigned_int>
            (in_stack_fffffffffffff810,
             CONCAT13(in_stack_fffffffffffff80f,
                      CONCAT12(in_stack_fffffffffffff80e,in_stack_fffffffffffff80c)),
             in_stack_fffffffffffff808,(char *)in_stack_fffffffffffff800,
             (uint)((ulong)in_stack_fffffffffffff7f8 >> 0x20),(char *)in_stack_fffffffffffff7f0);
  local_2b4 = 0x5d;
  local_2b8 = 0x2c2c2c5b;
  uVar8 = (*local_c0->_vptr_CharReader[2])
                    (local_c0,&local_2b8,(long)&local_2b4 + 1,local_98,local_b8);
  local_2b9 = (byte)uVar8 & 1;
  if ((uVar8 & 1) == 0) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffff810,
               (char *)CONCAT17(in_stack_fffffffffffff80f,
                                CONCAT16(in_stack_fffffffffffff80e,
                                         CONCAT24(in_stack_fffffffffffff80c,
                                                  in_stack_fffffffffffff808))),
               (uint)((ulong)in_stack_fffffffffffff800 >> 0x20),in_stack_fffffffffffff7f8);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2e0,"",&local_2e1);
  std::__cxx11::string::string(local_308,local_b8);
  JsonTest::checkStringEqual
            (in_stack_fffffffffffff810,
             (string *)
             CONCAT17(in_stack_fffffffffffff80f,
                      CONCAT16(in_stack_fffffffffffff80e,
                               CONCAT24(in_stack_fffffffffffff80c,in_stack_fffffffffffff808))),
             (string *)in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,
             (uint)((ulong)in_stack_fffffffffffff7f0 >> 0x20),(char *)in_stack_fffffffffffff7e8);
  std::__cxx11::string::~string(local_308);
  std::__cxx11::string::~string(local_2e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
  Json::Value::size((Value *)CONCAT17(in_stack_fffffffffffff80f,
                                      CONCAT16(in_stack_fffffffffffff80e,
                                               CONCAT24(in_stack_fffffffffffff80c,
                                                        in_stack_fffffffffffff808))));
  JsonTest::checkEqual<unsigned_int,unsigned_int>
            (in_stack_fffffffffffff810,
             CONCAT13(in_stack_fffffffffffff80f,
                      CONCAT12(in_stack_fffffffffffff80e,in_stack_fffffffffffff80c)),
             in_stack_fffffffffffff808,(char *)in_stack_fffffffffffff800,
             (uint)((ulong)in_stack_fffffffffffff7f8 >> 0x20),(char *)in_stack_fffffffffffff7f0);
  local_310 = 0x5d2c6c6c756e5b;
  uVar8 = (*local_c0->_vptr_CharReader[2])
                    (local_c0,&local_310,(long)&local_310 + 7,local_98,local_b8);
  local_311 = (byte)uVar8 & 1;
  if ((uVar8 & 1) == 0) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffff810,
               (char *)CONCAT17(in_stack_fffffffffffff80f,
                                CONCAT16(in_stack_fffffffffffff80e,
                                         CONCAT24(in_stack_fffffffffffff80c,
                                                  in_stack_fffffffffffff808))),
               (uint)((ulong)in_stack_fffffffffffff800 >> 0x20),in_stack_fffffffffffff7f8);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_338,"",&local_339);
  std::__cxx11::string::string(local_360,local_b8);
  JsonTest::checkStringEqual
            (in_stack_fffffffffffff810,
             (string *)
             CONCAT17(in_stack_fffffffffffff80f,
                      CONCAT16(in_stack_fffffffffffff80e,
                               CONCAT24(in_stack_fffffffffffff80c,in_stack_fffffffffffff808))),
             (string *)in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,
             (uint)((ulong)in_stack_fffffffffffff7f0 >> 0x20),(char *)in_stack_fffffffffffff7e8);
  std::__cxx11::string::~string(local_360);
  std::__cxx11::string::~string(local_338);
  std::allocator<char>::~allocator((allocator<char> *)&local_339);
  Json::Value::size((Value *)CONCAT17(in_stack_fffffffffffff80f,
                                      CONCAT16(in_stack_fffffffffffff80e,
                                               CONCAT24(in_stack_fffffffffffff80c,
                                                        in_stack_fffffffffffff808))));
  JsonTest::checkEqual<unsigned_int,unsigned_int>
            (in_stack_fffffffffffff810,
             CONCAT13(in_stack_fffffffffffff80f,
                      CONCAT12(in_stack_fffffffffffff80e,in_stack_fffffffffffff80c)),
             in_stack_fffffffffffff808,(char *)in_stack_fffffffffffff800,
             (uint)((ulong)in_stack_fffffffffffff7f8 >> 0x20),(char *)in_stack_fffffffffffff7f0);
  local_368 = 0x5d6c6c756e2c5b;
  uVar8 = (*local_c0->_vptr_CharReader[2])
                    (local_c0,&local_368,(long)&local_368 + 7,local_98,local_b8);
  local_369 = (byte)uVar8 & 1;
  if ((uVar8 & 1) == 0) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffff810,
               (char *)CONCAT17(in_stack_fffffffffffff80f,
                                CONCAT16(in_stack_fffffffffffff80e,
                                         CONCAT24(in_stack_fffffffffffff80c,
                                                  in_stack_fffffffffffff808))),
               (uint)((ulong)in_stack_fffffffffffff800 >> 0x20),in_stack_fffffffffffff7f8);
  }
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffff7f0,(char *)in_stack_fffffffffffff7e8);
  if (!bVar2) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffff810,
               (char *)CONCAT17(in_stack_fffffffffffff80f,
                                CONCAT16(in_stack_fffffffffffff80e,
                                         CONCAT24(in_stack_fffffffffffff80c,
                                                  in_stack_fffffffffffff808))),
               (uint)((ulong)in_stack_fffffffffffff800 >> 0x20),in_stack_fffffffffffff7f8);
  }
  Json::Value::size((Value *)CONCAT17(in_stack_fffffffffffff80f,
                                      CONCAT16(in_stack_fffffffffffff80e,
                                               CONCAT24(in_stack_fffffffffffff80c,
                                                        in_stack_fffffffffffff808))));
  JsonTest::checkEqual<unsigned_int,unsigned_int>
            (in_stack_fffffffffffff810,
             CONCAT13(in_stack_fffffffffffff80f,
                      CONCAT12(in_stack_fffffffffffff80e,in_stack_fffffffffffff80c)),
             in_stack_fffffffffffff808,(char *)in_stack_fffffffffffff800,
             (uint)((ulong)in_stack_fffffffffffff7f8 >> 0x20),(char *)in_stack_fffffffffffff7f0);
  local_36c[0] = 0;
  local_370 = 0x5d2c2c5b;
  uVar8 = (*local_c0->_vptr_CharReader[2])(local_c0,&local_370,local_36c,local_98,local_b8);
  local_371 = (byte)uVar8 & 1;
  if ((uVar8 & 1) == 0) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffff810,
               (char *)CONCAT17(in_stack_fffffffffffff80f,
                                CONCAT16(in_stack_fffffffffffff80e,
                                         CONCAT24(in_stack_fffffffffffff80c,
                                                  in_stack_fffffffffffff808))),
               (uint)((ulong)in_stack_fffffffffffff800 >> 0x20),in_stack_fffffffffffff7f8);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_398,"",&local_399);
  std::__cxx11::string::string(local_3c0,local_b8);
  JsonTest::checkStringEqual
            (in_stack_fffffffffffff810,
             (string *)
             CONCAT17(in_stack_fffffffffffff80f,
                      CONCAT16(in_stack_fffffffffffff80e,
                               CONCAT24(in_stack_fffffffffffff80c,in_stack_fffffffffffff808))),
             (string *)in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,
             (uint)((ulong)in_stack_fffffffffffff7f0 >> 0x20),(char *)in_stack_fffffffffffff7e8);
  std::__cxx11::string::~string(local_3c0);
  std::__cxx11::string::~string(local_398);
  std::allocator<char>::~allocator((allocator<char> *)&local_399);
  Json::Value::size((Value *)CONCAT17(in_stack_fffffffffffff80f,
                                      CONCAT16(in_stack_fffffffffffff80e,
                                               CONCAT24(in_stack_fffffffffffff80c,
                                                        in_stack_fffffffffffff808))));
  JsonTest::checkEqual<unsigned_int,unsigned_int>
            (in_stack_fffffffffffff810,
             CONCAT13(in_stack_fffffffffffff80f,
                      CONCAT12(in_stack_fffffffffffff80e,in_stack_fffffffffffff80c)),
             in_stack_fffffffffffff808,(char *)in_stack_fffffffffffff800,
             (uint)((ulong)in_stack_fffffffffffff7f8 >> 0x20),(char *)in_stack_fffffffffffff7f0);
  local_3d0 = 0x5d2c2c6c6c756e5b;
  local_3c8[0] = 0;
  uVar8 = (*local_c0->_vptr_CharReader[2])(local_c0,&local_3d0,local_3c8,local_98,local_b8);
  local_3d1 = (byte)uVar8 & 1;
  if ((uVar8 & 1) == 0) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffff810,
               (char *)CONCAT17(in_stack_fffffffffffff80f,
                                CONCAT16(in_stack_fffffffffffff80e,
                                         CONCAT24(in_stack_fffffffffffff80c,
                                                  in_stack_fffffffffffff808))),
               (uint)((ulong)in_stack_fffffffffffff800 >> 0x20),in_stack_fffffffffffff7f8);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3f8,"",&local_3f9);
  std::__cxx11::string::string(local_420,local_b8);
  JsonTest::checkStringEqual
            (in_stack_fffffffffffff810,
             (string *)
             CONCAT17(in_stack_fffffffffffff80f,
                      CONCAT16(in_stack_fffffffffffff80e,
                               CONCAT24(in_stack_fffffffffffff80c,in_stack_fffffffffffff808))),
             (string *)in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,
             (uint)((ulong)in_stack_fffffffffffff7f0 >> 0x20),(char *)in_stack_fffffffffffff7e8);
  std::__cxx11::string::~string(local_420);
  std::__cxx11::string::~string(local_3f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
  Json::Value::size((Value *)CONCAT17(in_stack_fffffffffffff80f,
                                      CONCAT16(in_stack_fffffffffffff80e,
                                               CONCAT24(in_stack_fffffffffffff80c,
                                                        in_stack_fffffffffffff808))));
  JsonTest::checkEqual<unsigned_int,unsigned_int>
            (in_stack_fffffffffffff810,
             CONCAT13(in_stack_fffffffffffff80f,
                      CONCAT12(in_stack_fffffffffffff80e,in_stack_fffffffffffff80c)),
             in_stack_fffffffffffff808,(char *)in_stack_fffffffffffff800,
             (uint)((ulong)in_stack_fffffffffffff7f8 >> 0x20),(char *)in_stack_fffffffffffff7f0);
  local_430 = 0x5d2c6c6c756e2c5b;
  local_428[0] = 0;
  uVar8 = (*local_c0->_vptr_CharReader[2])(local_c0,&local_430,local_428,local_98,local_b8);
  local_431 = (byte)uVar8 & 1;
  if ((uVar8 & 1) == 0) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffff810,
               (char *)CONCAT17(in_stack_fffffffffffff80f,
                                CONCAT16(in_stack_fffffffffffff80e,
                                         CONCAT24(in_stack_fffffffffffff80c,
                                                  in_stack_fffffffffffff808))),
               (uint)((ulong)in_stack_fffffffffffff800 >> 0x20),in_stack_fffffffffffff7f8);
  }
  result = *(TestResult **)(in_RDI + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_458,"",&local_459);
  std::__cxx11::string::string(local_480,local_b8);
  JsonTest::checkStringEqual
            (in_stack_fffffffffffff810,
             (string *)
             CONCAT17(in_stack_fffffffffffff80f,
                      CONCAT16(in_stack_fffffffffffff80e,
                               CONCAT24(in_stack_fffffffffffff80c,in_stack_fffffffffffff808))),
             (string *)in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,
             (uint)((ulong)in_stack_fffffffffffff7f0 >> 0x20),(char *)in_stack_fffffffffffff7e8);
  std::__cxx11::string::~string(local_480);
  std::__cxx11::string::~string(local_458);
  std::allocator<char>::~allocator((allocator<char> *)&local_459);
  actual_00 = *(Value **)(in_RDI + 8);
  expected = Json::Value::size((Value *)CONCAT17(in_stack_fffffffffffff80f,
                                                 CONCAT16(in_stack_fffffffffffff80e,
                                                          CONCAT24(in_stack_fffffffffffff80c,
                                                                   in_stack_fffffffffffff808))));
  JsonTest::checkEqual<unsigned_int,unsigned_int>
            (in_stack_fffffffffffff810,
             CONCAT13(in_stack_fffffffffffff80f,
                      CONCAT12(in_stack_fffffffffffff80e,in_stack_fffffffffffff80c)),
             in_stack_fffffffffffff808,(char *)in_stack_fffffffffffff800,
             (uint)((ulong)in_stack_fffffffffffff7f8 >> 0x20),(char *)in_stack_fffffffffffff7f0);
  local_490 = 0x5d6c6c756e2c2c5b;
  local_488[0] = 0;
  uVar8 = (*local_c0->_vptr_CharReader[2])(local_c0,&local_490,local_488,local_98,local_b8);
  bVar3 = (byte)uVar8;
  local_491 = bVar3 & 1;
  if ((uVar8 & 1) == 0) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffff810,
               (char *)CONCAT17(in_stack_fffffffffffff80f,
                                CONCAT16(in_stack_fffffffffffff80e,
                                         CONCAT24(in_stack_fffffffffffff80c,
                                                  in_stack_fffffffffffff808))),
               (uint)((ulong)in_stack_fffffffffffff800 >> 0x20),in_stack_fffffffffffff7f8);
  }
  uVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffff7f0,(char *)in_stack_fffffffffffff7e8);
  if (!(bool)uVar4) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffff810,
               (char *)CONCAT17(in_stack_fffffffffffff80f,
                                CONCAT16(in_stack_fffffffffffff80e,
                                         CONCAT24(in_stack_fffffffffffff80c,
                                                  in_stack_fffffffffffff808))),
               (uint)((ulong)in_stack_fffffffffffff800 >> 0x20),in_stack_fffffffffffff7f8);
  }
  uVar8 = (uint)((ulong)*(undefined8 *)(in_RDI + 8) >> 0x20);
  AVar9 = Json::Value::size((Value *)CONCAT17(in_stack_fffffffffffff80f,
                                              CONCAT16(in_stack_fffffffffffff80e,
                                                       CONCAT24(in_stack_fffffffffffff80c,
                                                                in_stack_fffffffffffff808))));
  JsonTest::checkEqual<unsigned_int,unsigned_int>
            (in_stack_fffffffffffff810,
             CONCAT13(in_stack_fffffffffffff80f,
                      CONCAT12(in_stack_fffffffffffff80e,in_stack_fffffffffffff80c)),
             in_stack_fffffffffffff808,(char *)in_stack_fffffffffffff800,
             (uint)((ulong)in_stack_fffffffffffff7f8 >> 0x20),(char *)in_stack_fffffffffffff7f0);
  local_4a0 = 0x5d2c2c2c5d5b5b;
  uVar10 = (*local_c0->_vptr_CharReader[2])
                     (local_c0,&local_4a0,(long)&local_4a0 + 7,local_98,local_b8);
  bVar5 = (byte)uVar10;
  local_4a1 = bVar5 & 1;
  if ((uVar10 & 1) == 0) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffff810,
               (char *)CONCAT17(in_stack_fffffffffffff80f,
                                CONCAT16(in_stack_fffffffffffff80e,
                                         CONCAT24(in_stack_fffffffffffff80c,
                                                  in_stack_fffffffffffff808))),
               (uint)((ulong)in_stack_fffffffffffff800 >> 0x20),in_stack_fffffffffffff7f8);
  }
  other = *(Value **)(in_RDI + 8);
  this_03 = (Value *)local_4c9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_4c9 + 1),"",(allocator *)this_03);
  std::__cxx11::string::string(local_4f0,local_b8);
  JsonTest::checkStringEqual
            (in_stack_fffffffffffff810,
             (string *)
             CONCAT17(in_stack_fffffffffffff80f,
                      CONCAT16(in_stack_fffffffffffff80e,
                               CONCAT24(in_stack_fffffffffffff80c,in_stack_fffffffffffff808))),
             (string *)in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,
             (uint)((ulong)in_stack_fffffffffffff7f0 >> 0x20),(char *)in_stack_fffffffffffff7e8);
  std::__cxx11::string::~string(local_4f0);
  std::__cxx11::string::~string((string *)(local_4c9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_4c9);
  Json::Value::size((Value *)CONCAT17(in_stack_fffffffffffff80f,
                                      CONCAT16(in_stack_fffffffffffff80e,
                                               CONCAT24(in_stack_fffffffffffff80c,
                                                        in_stack_fffffffffffff808))));
  JsonTest::checkEqual<unsigned_int,unsigned_int>
            (in_stack_fffffffffffff810,
             CONCAT13(in_stack_fffffffffffff80f,
                      CONCAT12(in_stack_fffffffffffff80e,in_stack_fffffffffffff80c)),
             in_stack_fffffffffffff808,(char *)in_stack_fffffffffffff800,
             (uint)((ulong)in_stack_fffffffffffff7f8 >> 0x20),(char *)in_stack_fffffffffffff7f0);
  Json::Value::operator[](in_stack_fffffffffffffa68,index_00);
  Json::Value::Value(this_03,other);
  JsonTest::checkEqual<Json::ValueType,Json::Value>
            (result,expected,actual_00,
             (char *)CONCAT17(bVar3,CONCAT16(uVar4,CONCAT24(in_stack_fffffffffffff88c,AVar9))),uVar8
             ,(char *)CONCAT17(bVar5,in_stack_fffffffffffff878));
  Json::Value::~Value((Value *)in_stack_fffffffffffff820);
  local_520 = 0x5d2c2c5d5b2c5b;
  uVar10 = (*local_c0->_vptr_CharReader[2])
                     (local_c0,&local_520,(long)&local_520 + 7,local_98,local_b8);
  local_521 = (byte)uVar10 & 1;
  if ((uVar10 & 1) == 0) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffff810,
               (char *)CONCAT17(in_stack_fffffffffffff80f,
                                CONCAT16(in_stack_fffffffffffff80e,
                                         CONCAT24(in_stack_fffffffffffff80c,
                                                  in_stack_fffffffffffff808))),
               (uint)((ulong)in_stack_fffffffffffff800 >> 0x20),in_stack_fffffffffffff7f8);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_548,"",&local_549);
  std::__cxx11::string::string(local_570,local_b8);
  JsonTest::checkStringEqual
            (in_stack_fffffffffffff810,
             (string *)
             CONCAT17(in_stack_fffffffffffff80f,
                      CONCAT16(in_stack_fffffffffffff80e,
                               CONCAT24(in_stack_fffffffffffff80c,in_stack_fffffffffffff808))),
             (string *)in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,
             (uint)((ulong)in_stack_fffffffffffff7f0 >> 0x20),(char *)in_stack_fffffffffffff7e8);
  std::__cxx11::string::~string(local_570);
  std::__cxx11::string::~string(local_548);
  std::allocator<char>::~allocator((allocator<char> *)&local_549);
  this_02 = *(Value **)(in_RDI + 8);
  Json::Value::size((Value *)CONCAT17(in_stack_fffffffffffff80f,
                                      CONCAT16(in_stack_fffffffffffff80e,
                                               CONCAT24(in_stack_fffffffffffff80c,
                                                        in_stack_fffffffffffff808))));
  JsonTest::checkEqual<unsigned_int,unsigned_int>
            (in_stack_fffffffffffff810,
             CONCAT13(in_stack_fffffffffffff80f,
                      CONCAT12(in_stack_fffffffffffff80e,in_stack_fffffffffffff80c)),
             in_stack_fffffffffffff808,(char *)in_stack_fffffffffffff800,
             (uint)((ulong)in_stack_fffffffffffff7f8 >> 0x20),(char *)in_stack_fffffffffffff7f0);
  line = (uint)((ulong)in_stack_fffffffffffff800 >> 0x20);
  this_01 = *(TestResult **)(in_RDI + 8);
  Json::Value::operator[](in_stack_fffffffffffffa68,index_00);
  Json::Value::Value(this_03,other);
  JsonTest::checkEqual<Json::ValueType,Json::Value>
            (result,expected,actual_00,
             (char *)CONCAT17(bVar3,CONCAT16(uVar4,CONCAT24(in_stack_fffffffffffff88c,AVar9))),uVar8
             ,(char *)CONCAT17(bVar5,in_stack_fffffffffffff878));
  Json::Value::~Value(this_02);
  _local_5a0 = 0x5d5d5b2c2c2c5b;
  uVar10 = (*local_c0->_vptr_CharReader[2])
                     (local_c0,local_5a0,&stack0xfffffffffffffa67,local_98,local_b8);
  uVar6 = (undefined1)uVar10;
  if ((uVar10 & 1) == 0) {
    JsonTest::TestResult::addFailure
              (this_01,(char *)CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffff80e,
                                                       CONCAT24(in_stack_fffffffffffff80c,
                                                                in_stack_fffffffffffff808))),line,
               in_stack_fffffffffffff7f8);
  }
  uVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffff7f0,(char *)in_stack_fffffffffffff7e8);
  if (!(bool)uVar7) {
    JsonTest::TestResult::addFailure
              (this_01,(char *)CONCAT17(uVar6,CONCAT16(uVar7,CONCAT24(in_stack_fffffffffffff80c,
                                                                      in_stack_fffffffffffff808))),
               line,in_stack_fffffffffffff7f8);
  }
  uVar10 = (uint)((ulong)in_stack_fffffffffffff7f8 >> 0x20);
  file = *(char **)(in_RDI + 8);
  actual = Json::Value::size((Value *)CONCAT17(uVar6,CONCAT16(uVar7,CONCAT24(
                                                  in_stack_fffffffffffff80c,
                                                  in_stack_fffffffffffff808))));
  JsonTest::checkEqual<unsigned_int,unsigned_int>
            (this_01,CONCAT13(uVar6,CONCAT12(uVar7,in_stack_fffffffffffff80c)),actual,file,uVar10,
             (char *)in_stack_fffffffffffff7f0);
  uVar1 = _local_5a0;
  this_00 = *(CharReaderBuilder **)(in_RDI + 8);
  index_00 = (ArrayIndex)((ulong)_local_5a0 >> 0x20);
  index = index_00;
  _local_5a0 = uVar1;
  Json::Value::operator[](in_stack_fffffffffffffa68,index);
  Json::Value::Value(this_03,other);
  JsonTest::checkEqual<Json::ValueType,Json::Value>
            (result,expected,actual_00,
             (char *)CONCAT17(bVar3,CONCAT16(uVar4,CONCAT24(in_stack_fffffffffffff88c,AVar9))),uVar8
             ,(char *)CONCAT17(bVar5,in_stack_fffffffffffff878));
  Json::Value::~Value(this_02);
  if (local_c0 != (CharReader *)0x0) {
    (*local_c0->_vptr_CharReader[1])();
  }
  std::__cxx11::string::~string(local_b8);
  Json::Value::~Value(this_02);
  Json::CharReaderBuilder::~CharReaderBuilder(this_00);
  return;
}

Assistant:

JSONTEST_FIXTURE(CharReaderAllowDropNullTest, issue178) {
  Json::CharReaderBuilder b;
  b.settings_["allowDroppedNullPlaceholders"] = true;
  Json::Value root;
  std::string errs;
  Json::CharReader* reader(b.newCharReader());
  {
    char const doc[] = "{\"a\":,\"b\":true}";
    bool ok = reader->parse(
        doc, doc + std::strlen(doc),
        &root, &errs);
    JSONTEST_ASSERT(ok);
    JSONTEST_ASSERT_STRING_EQUAL("", errs);
    JSONTEST_ASSERT_EQUAL(2u, root.size());
    JSONTEST_ASSERT_EQUAL(Json::nullValue, root.get("a", true));
  }
  {
    char const doc[] = "{\"a\":}";
    bool ok = reader->parse(
        doc, doc + std::strlen(doc),
        &root, &errs);
    JSONTEST_ASSERT(ok);
    JSONTEST_ASSERT_STRING_EQUAL("", errs);
    JSONTEST_ASSERT_EQUAL(1u, root.size());
    JSONTEST_ASSERT_EQUAL(Json::nullValue, root.get("a", true));
  }
  {
    char const doc[] = "[]";
    bool ok = reader->parse(
        doc, doc + std::strlen(doc),
        &root, &errs);
    JSONTEST_ASSERT(ok);
    JSONTEST_ASSERT(errs == "");
    JSONTEST_ASSERT_EQUAL(0u, root.size());
    JSONTEST_ASSERT_EQUAL(Json::arrayValue, root);
  }
  {
    char const doc[] = "[null]";
    bool ok = reader->parse(
        doc, doc + std::strlen(doc),
        &root, &errs);
    JSONTEST_ASSERT(ok);
    JSONTEST_ASSERT(errs == "");
    JSONTEST_ASSERT_EQUAL(1u, root.size());
  }
  {
    char const doc[] = "[,]";
    bool ok = reader->parse(
        doc, doc + std::strlen(doc),
        &root, &errs);
    JSONTEST_ASSERT(ok);
    JSONTEST_ASSERT_STRING_EQUAL("", errs);
    JSONTEST_ASSERT_EQUAL(2u, root.size());
  }
  {
    char const doc[] = "[,,,]";
    bool ok = reader->parse(
        doc, doc + std::strlen(doc),
        &root, &errs);
    JSONTEST_ASSERT(ok);
    JSONTEST_ASSERT_STRING_EQUAL("", errs);
    JSONTEST_ASSERT_EQUAL(4u, root.size());
  }
  {
    char const doc[] = "[null,]";
    bool ok = reader->parse(
        doc, doc + std::strlen(doc),
        &root, &errs);
    JSONTEST_ASSERT(ok);
    JSONTEST_ASSERT_STRING_EQUAL("", errs);
    JSONTEST_ASSERT_EQUAL(2u, root.size());
  }
  {
    char const doc[] = "[,null]";
    bool ok = reader->parse(
        doc, doc + std::strlen(doc),
        &root, &errs);
    JSONTEST_ASSERT(ok);
    JSONTEST_ASSERT(errs == "");
    JSONTEST_ASSERT_EQUAL(2u, root.size());
  }
  {
    char const doc[] = "[,,]";
    bool ok = reader->parse(
        doc, doc + std::strlen(doc),
        &root, &errs);
    JSONTEST_ASSERT(ok);
    JSONTEST_ASSERT_STRING_EQUAL("", errs);
    JSONTEST_ASSERT_EQUAL(3u, root.size());
  }
  {
    char const doc[] = "[null,,]";
    bool ok = reader->parse(
        doc, doc + std::strlen(doc),
        &root, &errs);
    JSONTEST_ASSERT(ok);
    JSONTEST_ASSERT_STRING_EQUAL("", errs);
    JSONTEST_ASSERT_EQUAL(3u, root.size());
  }
  {
    char const doc[] = "[,null,]";
    bool ok = reader->parse(
        doc, doc + std::strlen(doc),
        &root, &errs);
    JSONTEST_ASSERT(ok);
    JSONTEST_ASSERT_STRING_EQUAL("", errs);
    JSONTEST_ASSERT_EQUAL(3u, root.size());
  }
  {
    char const doc[] = "[,,null]";
    bool ok = reader->parse(
        doc, doc + std::strlen(doc),
        &root, &errs);
    JSONTEST_ASSERT(ok);
    JSONTEST_ASSERT(errs == "");
    JSONTEST_ASSERT_EQUAL(3u, root.size());
  }
  {
    char const doc[] = "[[],,,]";
    bool ok = reader->parse(
        doc, doc + std::strlen(doc),
        &root, &errs);
    JSONTEST_ASSERT(ok);
    JSONTEST_ASSERT_STRING_EQUAL("", errs);
    JSONTEST_ASSERT_EQUAL(4u, root.size());
    JSONTEST_ASSERT_EQUAL(Json::arrayValue, root[0u]);
  }
  {
    char const doc[] = "[,[],,]";
    bool ok = reader->parse(
        doc, doc + std::strlen(doc),
        &root, &errs);
    JSONTEST_ASSERT(ok);
    JSONTEST_ASSERT_STRING_EQUAL("", errs);
    JSONTEST_ASSERT_EQUAL(4u, root.size());
    JSONTEST_ASSERT_EQUAL(Json::arrayValue, root[1u]);
  }
  {
    char const doc[] = "[,,,[]]";
    bool ok = reader->parse(
        doc, doc + std::strlen(doc),
        &root, &errs);
    JSONTEST_ASSERT(ok);
    JSONTEST_ASSERT(errs == "");
    JSONTEST_ASSERT_EQUAL(4u, root.size());
    JSONTEST_ASSERT_EQUAL(Json::arrayValue, root[3u]);
  }
  delete reader;
}